

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O1

Vec_Int_t * Pdr_ManCubeToLits(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,int fCompl,int fNext)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  timespec ts;
  long local_48;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    local_48 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p->vLits->nSize = 0;
  if (0 < pCube->nLits) {
    lVar4 = 0;
    do {
      uVar1 = *(uint *)(&pCube->field_0x14 + lVar4 * 4);
      if (uVar1 != 0xffffffff) {
        if (fNext == 0) {
          if ((int)uVar1 < 0) goto LAB_005f0fc1;
          uVar3 = (uVar1 >> 1) + p->pAig->nTruePis;
          if ((int)uVar3 < 0) goto LAB_005f0f83;
          pVVar5 = p->pAig->vCis;
        }
        else {
          if ((int)uVar1 < 0) {
LAB_005f0fc1:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar3 = (uVar1 >> 1) + p->pAig->nTruePos;
          if ((int)uVar3 < 0) goto LAB_005f0f83;
          pVVar5 = p->pAig->vCos;
        }
        if (pVVar5->nSize <= (int)uVar3) {
LAB_005f0f83:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (fNext == 0) {
          iVar2 = 3;
        }
        else {
          if ((int)uVar1 < 0) goto LAB_005f0fa2;
          iVar2 = 2 - (uVar1 & 1);
        }
        iVar2 = Pdr_ObjSatVar(p,k,iVar2,(Aig_Obj_t *)pVVar5->pArray[uVar3]);
        if (iVar2 < 0) {
          __assert_fail("iVar >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                        ,0x9f,
                        "Vec_Int_t *Pdr_ManCubeToLits(Pdr_Man_t *, int, Pdr_Set_t *, int, int)");
        }
        if ((int)*(uint *)(&pCube->field_0x14 + lVar4 * 4) < 0) {
LAB_005f0fa2:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if (1 < (uint)fCompl) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(p->vLits,(*(uint *)(&pCube->field_0x14 + lVar4 * 4) & 1 ^ fCompl) + iVar2 * 2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pCube->nLits);
  }
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->tCnf = p->tCnf + lVar4 + local_48;
  return p->vLits;
}

Assistant:

Vec_Int_t * Pdr_ManCubeToLits( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, int fCompl, int fNext )
{
    Aig_Obj_t * pObj;
    int i, iVar, iVarMax = 0;
    abctime clk = Abc_Clock();
    Vec_IntClear( p->vLits );
//    assert( !(fNext && fCompl) );
    for ( i = 0; i < pCube->nLits; i++ )
    {
        if ( pCube->Lits[i] == -1 )
            continue;
        if ( fNext )
            pObj = Saig_ManLi( p->pAig, Abc_Lit2Var(pCube->Lits[i]) );
        else
            pObj = Saig_ManLo( p->pAig, Abc_Lit2Var(pCube->Lits[i]) );
        iVar = Pdr_ObjSatVar( p, k, fNext ? 2 - Abc_LitIsCompl(pCube->Lits[i]) : 3, pObj ); assert( iVar >= 0 );
        iVarMax = Abc_MaxInt( iVarMax, iVar );
        Vec_IntPush( p->vLits, Abc_Var2Lit( iVar, fCompl ^ Abc_LitIsCompl(pCube->Lits[i]) ) );
    }
//    sat_solver_setnvars( Pdr_ManSolver(p, k), iVarMax + 1 );
    p->tCnf += Abc_Clock() - clk;
    return p->vLits;
}